

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMapIterator.cpp
# Opt level: O3

Var Js::JavascriptMapIterator::EntryNext(RecyclableObject *function,CallInfo callInfo,...)

{
  WriteBarrierPtr<void> *addr;
  Type TVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *this;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var aValue;
  JavascriptMapIterator *pJVar6;
  WriteBarrierPtr<void> WVar7;
  DynamicObject *pDVar8;
  int in_stack_00000010;
  undefined1 local_58 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> entry;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMapIterator.cpp"
                                ,0x16,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00cd88c3;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_58 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_58,(CallInfo *)&args.super_Arguments.Values);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar2->super_ScriptContextBase).javascriptLibrary;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMapIterator.cpp"
                                ,0x1a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00cd88c3;
    *puVar5 = 0;
  }
  aValue = Arguments::operator[]((Arguments *)local_58,0);
  bVar4 = VarIs<Js::JavascriptMapIterator>(aValue);
  if (!bVar4) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ebf3,L"Map Iterator.prototype.next");
  }
  pJVar6 = VarTo<Js::JavascriptMapIterator>(aValue);
  if (((pJVar6->m_map).ptr == (JavascriptMap *)0x0) ||
     (bVar4 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
              ::Iterator::Next(&pJVar6->m_mapIterator), !bVar4)) {
    (pJVar6->m_map).ptr = (JavascriptMap *)0x0;
    pDVar8 = JavascriptLibrary::CreateIteratorResultObjectDone(this);
    return pDVar8;
  }
  JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::KeyValuePair
            ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
             &callInfo_local,&((pJVar6->m_mapIterator).current.ptr)->data);
  TVar1 = pJVar6->m_kind;
  WVar7.ptr = (void *)callInfo_local;
  if ((TVar1 != Key) && (WVar7 = entry.key, TVar1 != Value)) {
    if (TVar1 == KeyAndValue) {
      WVar7.ptr = JavascriptLibrary::CreateArray(this,2);
      addr = &entry.value;
      Memory::Recycler::WBSetBit((char *)addr);
      entry.value.ptr = (void *)callInfo_local;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      (*(((JavascriptArray *)WVar7.ptr)->super_ArrayObject).super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x29])(WVar7.ptr,0,entry.value.ptr,0);
      Memory::Recycler::WBSetBit((char *)addr);
      entry.value = entry.key;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      (*(((JavascriptArray *)WVar7.ptr)->super_ArrayObject).super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x29])(WVar7.ptr,1,entry.value.ptr,0);
      goto LAB_00cd88a9;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMapIterator.cpp"
                                ,0x3d,"(iterator->m_kind == JavascriptMapIteratorKind::Value)",
                                "iterator->m_kind == JavascriptMapIteratorKind::Value");
    if (!bVar4) {
LAB_00cd88c3:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    WVar7 = entry.key;
  }
  Memory::Recycler::WBSetBit((char *)&entry.value);
  entry.value.ptr = WVar7.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&entry.value);
  WVar7.ptr = entry.value.ptr;
LAB_00cd88a9:
  pDVar8 = JavascriptLibrary::CreateIteratorResultObject(this,WVar7.ptr,false);
  return pDVar8;
}

Assistant:

Var JavascriptMapIterator::EntryNext(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        Var thisObj = args[0];

        if (!VarIs<JavascriptMapIterator>(thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedMapIterator, _u("Map Iterator.prototype.next"));
        }

        JavascriptMapIterator* iterator = VarTo<JavascriptMapIterator>(thisObj);
        JavascriptMap* map = iterator->m_map;
        auto& mapIterator = iterator->m_mapIterator;

        if (map == nullptr || !mapIterator.Next())
        {
            iterator->m_map = nullptr;
            return library->CreateIteratorResultObjectDone();
        }

        auto entry = mapIterator.Current();
        Var result;

        if (iterator->m_kind == JavascriptMapIteratorKind::KeyAndValue)
        {
            JavascriptArray* keyValueTuple = library->CreateArray(2);
            keyValueTuple->SetItem(0, entry.Key(), PropertyOperation_None);
            keyValueTuple->SetItem(1, entry.Value(), PropertyOperation_None);
            result = keyValueTuple;
        }
        else if (iterator->m_kind == JavascriptMapIteratorKind::Key)
        {
            result = entry.Key();
        }
        else
        {
            Assert(iterator->m_kind == JavascriptMapIteratorKind::Value);
            result = entry.Value();
        }

        return library->CreateIteratorResultObject(result);
    }